

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

void slang::ast::Statement::bindScopeInitializers
               (ASTContext *context,SmallVectorBase<const_slang::ast::Statement_*> *results)

{
  Scope *this;
  Compilation *this_00;
  Symbol *member;
  VariableSymbol *args;
  SourceRange range;
  VariableDeclStatement *local_40;
  SourceRange local_38;
  
  this = (context->scope).ptr;
  this_00 = this->compilation;
  if (this->deferredMemberIndex != Invalid) {
    Scope::elaborate(this);
  }
  args = (VariableSymbol *)this->firstMember;
  if (args != (VariableSymbol *)0x0) {
    do {
      if (((args->super_ValueSymbol).super_Symbol.kind == Variable) &&
         (((args->flags).m_bits & 2) == 0)) {
        local_38.startLoc = (args->super_ValueSymbol).super_Symbol.location;
        local_38.endLoc =
             (SourceLocation)
             ((args->super_ValueSymbol).super_Symbol.name._M_len * 0x10000000 +
             (long)local_38.startLoc);
        local_40 = BumpAllocator::
                   emplace<slang::ast::VariableDeclStatement,slang::ast::VariableSymbol_const&,slang::SourceRange&>
                             (&this_00->super_BumpAllocator,args,&local_38);
        SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                  ((SmallVectorBase<slang::ast::Statement_const*> *)results,(Statement **)&local_40)
        ;
      }
      args = (VariableSymbol *)(args->super_ValueSymbol).super_Symbol.nextInScope;
    } while (args != (VariableSymbol *)0x0);
  }
  return;
}

Assistant:

void Statement::bindScopeInitializers(const ASTContext& context,
                                      SmallVectorBase<const Statement*>& results) {
    // This relies on the language requiring all declarations be at the
    // start of a statement block. Additional work would be required to
    // support declarations anywhere in the block, because as written all
    // of the initialization will happen at the start of the block, which
    // might have different side-effects than if they were initialized in
    // the middle somewhere. The parser currently enforces this for us.
    auto& scope = *context.scope;
    auto& comp = scope.getCompilation();
    for (auto& member : scope.members()) {
        if (member.kind != SymbolKind::Variable)
            continue;

        // Filter out implicitly generated function return type variables -- they are
        // initialized elsewhere. Note that we manufacture a somewhat reasonable
        // source range here, since we don't have the real one.
        auto& var = member.as<VariableSymbol>();
        if (!var.flags.has(VariableFlags::CompilerGenerated)) {
            SourceRange range{var.location, var.location + var.name.length()};
            results.push_back(comp.emplace<VariableDeclStatement>(var, range));
        }
    }
}